

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O1

void __thiscall hdc::Driver::callCppCompiler(Driver *this)

{
  stringstream s;
  char *local_1b8;
  char local_1a8 [16];
  stringstream local_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"g++ gen.cpp -fpermissive -o ",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_188,(this->outputName)._M_dataplus._M_p,(this->outputName)._M_string_length);
  std::__cxx11::stringbuf::str();
  system(local_1b8);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void Driver::callCppCompiler() {
    std::stringstream s;

    s << "g++ gen.cpp -fpermissive -o " << outputName;
    system(s.str().c_str());
}